

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

UTF_RET UTF_uj16_to_uj8(UTF_UC16 *uj16,size_t uj16size,UTF_UC8 *uj8,size_t uj8size)

{
  UTF_UC16 *pUVar1;
  UTF_UC16 UVar2;
  bool bVar3;
  UTF_UC16 UVar4;
  UTF_RET UVar5;
  ulong in_RAX;
  UTF_UC8 *pUVar6;
  UTF_UC8 *pUVar7;
  UTF_UC8 uc8 [4];
  UTF_UC16 local_34;
  UTF_UC16 UStack_32;
  
  pUVar1 = uj16 + uj16size;
  pUVar6 = uj8 + (uj8size - 1);
  _uc8 = in_RAX;
  do {
    if (uj16 == pUVar1) {
LAB_001018d6:
      pUVar6 = uj8;
      UVar5 = UTF_SUCCESS;
LAB_001018dc:
      *pUVar6 = '\0';
      return UVar5;
    }
    UVar2 = *uj16;
    if ((UVar2 & 0xfc00U) == 0xd800) {
      uj16 = uj16 + 1;
      if (uj16 == pUVar1) {
        UVar5 = UTF_INSUFFICIENT_BUFFER;
        if (uj8 == pUVar6) goto LAB_001018dc;
        *uj8 = '?';
        uj8 = uj8 + 1;
        goto LAB_001018d6;
      }
      UVar4 = *uj16;
    }
    else {
      UVar4 = L'\0';
    }
    _uc8 = CONCAT26(UVar4,CONCAT24(UVar2,uc8));
    bVar3 = UTF_uc16_to_uc8(&local_34,uc8);
    if (!bVar3) {
      _uc8 = _uc8 & 0xffffffff;
    }
    if (uj8 == pUVar6) {
LAB_001018c3:
      UVar5 = UTF_INSUFFICIENT_BUFFER;
      goto LAB_001018dc;
    }
    pUVar7 = uj8 + 1;
    *uj8 = uc8[0];
    if (uc8[1] != '\0') {
      if (pUVar7 == pUVar6) goto LAB_001018c3;
      pUVar7 = uj8 + 2;
      uj8[1] = uc8[1];
      if (uc8[2] != '\0') {
        if (pUVar7 == pUVar6) goto LAB_001018c3;
        pUVar7 = uj8 + 3;
        uj8[2] = uc8[2];
        if (uc8[3] != '\0') {
          if (pUVar7 == pUVar6) goto LAB_001018c3;
          uj8[3] = uc8[3];
          pUVar7 = uj8 + 4;
        }
      }
    }
    uj16 = uj16 + 1;
    uj8 = pUVar7;
  } while( true );
}

Assistant:

static __inline UTF_RET
UTF_uj16_to_uj8(const UTF_UC16 *uj16, UTF_SIZE_T uj16size, UTF_UC8 *uj8, UTF_SIZE_T uj8size)
{
    UTF_UC16 uc16[2];
    UTF_UC8 uc8[4];
    const UTF_UC16 *uj16end = uj16 + uj16size;
    UTF_UC8 *uj8end = uj8 + uj8size - 1;

    if (!uj8size && uj16size)
        return UTF_INSUFFICIENT_BUFFER;

    for (; uj16 != uj16end; ++uj16)
    {
        if (UTF_uc16_is_surrogate_high(*uj16))
        {
            uc16[0] = *uj16;
            if (++uj16 == uj16end)
            {
                if (!UTF_DEFAULT_CHAR)
                {
                    *uj8 = 0;
                    return UTF_INVALID;
                }
                if (uj8 == uj8end)
                {
                    *uj8 = 0;
                    return UTF_INSUFFICIENT_BUFFER;
                }
                *uj8++ = UTF_STATIC_CAST(UTF_UC8, UTF_DEFAULT_CHAR);
                *uj8 = 0;
                return UTF_SUCCESS;
            }
            uc16[1] = *uj16;
        }
        else
        {
            uc16[0] = *uj16;
            uc16[1] = 0;
        }

        if (!UTF_uc16_to_uc8(uc16, uc8))
        {
            if (!UTF_DEFAULT_CHAR)
            {
                *uj8 = 0;
                return UTF_INVALID;
            }
            uc16[0] = UTF_DEFAULT_CHAR;
            uc16[1] = 0;
        }

        if (uj8 == uj8end)
        {
            *uj8 = 0;
            return UTF_INSUFFICIENT_BUFFER;
        }

        *uj8++ = uc8[0];
        if (uc8[1])
        {
            if (uj8 == uj8end)
            {
                *uj8 = 0;
                return UTF_INSUFFICIENT_BUFFER;
            }
            *uj8++ = uc8[1];
            if (uc8[2])
            {
                if (uj8 == uj8end)
                {
                    *uj8 = 0;
                    return UTF_INSUFFICIENT_BUFFER;
                }
                *uj8++ = uc8[2];
                if (uc8[3])
                {
                    if (uj8 == uj8end)
                    {
                        *uj8 = 0;
                        return UTF_INSUFFICIENT_BUFFER;
                    }
                    *uj8++ = uc8[3];
                }
            }
        }
    }
    *uj8 = 0;
    return UTF_SUCCESS;
}